

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Jupiter::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  uint uVar2;
  char *hostname;
  char *port;
  Data *extraout_RAX;
  Data *extraout_RAX_00;
  undefined4 in_register_00000034;
  Data *local_68;
  addrinfo *info;
  string local_50;
  Data *local_30;
  addrinfo *info_head;
  bool andListen_local;
  char *pcStack_20;
  unsigned_short iPort_local;
  char *hostname_local;
  Socket *this_local;
  
  pcStack_20 = (char *)CONCAT44(in_register_00000034,__fd);
  info_head._6_2_ = (unsigned_short)__addr;
  info_head._5_1_ = (byte)__len & 1;
  hostname_local = (char *)this;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_data->bound_host,pcStack_20);
  this->m_data->bound_port = info_head._6_2_;
  hostname = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->m_data->bound_host);
  std::__cxx11::to_string(&local_50,(uint)this->m_data->bound_port);
  port = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                   (&local_50);
  local_68 = (Data *)getAddrInfo(hostname,port);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = local_68;
  if (local_68 != (Data *)0x0) {
    do {
      iVar1 = socket(*(int *)((long)&(local_68->buffer).m_buffer + 4),this->m_data->sockType,
                     this->m_data->sockProto);
      this->m_data->rawSock = iVar1;
      if (this->m_data->rawSock == -1) {
        local_68 = (Data *)(local_68->remote_host)._M_string_length;
      }
      else {
        iVar1 = ::bind(this->m_data->rawSock,*(sockaddr **)&local_68->rawSock,
                       (socklen_t)(local_68->buffer).m_buffer_size);
        if (iVar1 != -1) {
          freeAddrInfo((addrinfo *)local_30);
          local_68 = extraout_RAX;
          if (((info_head._5_1_ & 1) != 0) && (local_68 = this->m_data, local_68->sockType == 1)) {
            uVar2 = listen(this->m_data->rawSock,0x1000);
            local_68 = (Data *)(ulong)uVar2;
            if (uVar2 == 0xffffffff) {
              this_local._7_1_ = 0;
              goto LAB_001c5082;
            }
          }
          this_local._7_1_ = 1;
          goto LAB_001c5082;
        }
        ::close(this->m_data->rawSock);
        this->m_data->rawSock = -1;
        local_68 = (Data *)(local_68->remote_host)._M_string_length;
      }
    } while (local_68 != (Data *)0x0);
    freeAddrInfo((addrinfo *)local_30);
    local_68 = extraout_RAX_00;
  }
  this_local._7_1_ = 0;
LAB_001c5082:
  return (int)CONCAT71((int7)((ulong)local_68 >> 8),this_local._7_1_);
}

Assistant:

bool Jupiter::Socket::bind(const char *hostname, unsigned short iPort, bool andListen) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init()) {
		return false;
	}
#endif // _WIN32
	m_data->bound_host = hostname;
	m_data->bound_port = iPort;
	addrinfo *info_head = Jupiter::Socket::getAddrInfo(m_data->bound_host.c_str(), std::to_string(m_data->bound_port).c_str());
	if (info_head != nullptr) {
		addrinfo *info = info_head;
		do {
			m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
			if (m_data->rawSock == INVALID_SOCKET) {
				info = info->ai_next;
				continue;
			}

			if (::bind(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR) {
#if defined _WIN32
				::closesocket(m_data->rawSock);
#else // _WIN32
				::close(m_data->rawSock);
#endif // WIN32
				m_data->rawSock = INVALID_SOCKET;
				info = info->ai_next;
				continue;
			}

			Jupiter::Socket::freeAddrInfo(info_head);
			if (andListen && m_data->sockType == SOCK_STREAM && ::listen(m_data->rawSock, SOMAXCONN) == SOCKET_ERROR) {
				return false;
			}

			return true;
		} while (info != nullptr);
		Jupiter::Socket::freeAddrInfo(info_head);
	}
	return false;
}